

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O2

void number_suite::test_double_min(void)

{
  encoder_type encoder;
  ostringstream result;
  undefined4 local_1d4;
  size_type local_1d0 [4];
  double local_1b0;
  undefined **local_1a8 [5];
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_1a8[0] = &PTR__base_00114b78;
  local_1b0 = 2.2250738585072014e-308;
  local_1a8[1] = (undefined **)local_180;
  local_1d0[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::floating_value<double>
                           ((basic_encoder<char,_24UL> *)local_1a8,&local_1b0);
  local_1d4 = 0x15;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(std::numeric_limits<double>::min())","21",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x1d3,"void number_suite::test_double_min()",local_1d0,&local_1d4);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[22]>
            ("result.str()","\"2.22507385850720e-308\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x1d4,"void number_suite::test_double_min()",local_1d0,"2.22507385850720e-308");
  std::__cxx11::string::~string((string *)local_1d0);
  (*(code *)*local_1a8[0])();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_double_min()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(std::numeric_limits<double>::min()), 21);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "2.22507385850720e-308");
}